

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

bool __thiscall Instruction::isJump(Instruction *this)

{
  uint8_t uVar1;
  Instruction *this_local;
  
  uVar1 = this->m_OpCode;
  if (((((uVar1 == '\x10') || (uVar1 == ' ')) || (uVar1 == '\"')) ||
      ((((uVar1 == '0' || (uVar1 == 'L')) || ((uVar1 == '\\' || ((uVar1 == 'l' || (uVar1 == '|')))))
        ) || (uVar1 == 0x80)))) || (((uVar1 == 0xd0 || (uVar1 == 0xdc)) || (uVar1 == 0xfc)))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Instruction::isJump() const {
    switch(m_OpCode) {
    case 0x10: //Branch if Plus
    case 0x20: //Jump to Subroutine
    case 0x30: //Branch if Minus
    case 0x22: //Jump to Subroutine
    case 0x4C: //Jump
    case 0x5C: //Jump
    case 0x6C: //Jump
    case 0x7C: //Jump
    case 0x80: //Branch Always
    case 0xD0: //Branch if Not Equal
    case 0xDC: //Jump
    case 0xFC: //Jump to Subroutine
        return true;
    default:
        return false;
    }
}